

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App_inl.hpp
# Opt level: O2

App * __thiscall CLI::App::name(App *this,string *app_name)

{
  string *psVar1;
  App *base;
  string *psVar2;
  OptionAlreadyAdded *this_00;
  string oname;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if (this->parent_ == (App *)0x0) {
    ::std::__cxx11::string::_M_assign((string *)&this->name_);
  }
  else {
    psVar1 = &this->name_;
    ::std::__cxx11::string::string((string *)&oname,(string *)psVar1);
    ::std::__cxx11::string::_M_assign((string *)psVar1);
    base = _get_fallthrough_parent(this);
    psVar2 = _compare_subcommand_names_abi_cxx11_(this,this,base);
    if (psVar2->_M_string_length != 0) {
      ::std::__cxx11::string::_M_assign((string *)psVar1);
      this_00 = (OptionAlreadyAdded *)__cxa_allocate_exception(0x38);
      ::std::operator+(&local_40,app_name," conflicts with existing subcommand names");
      OptionAlreadyAdded::OptionAlreadyAdded(this_00,&local_40);
      __cxa_throw(this_00,&OptionAlreadyAdded::typeinfo,Error::~Error);
    }
    ::std::__cxx11::string::~string((string *)&oname);
  }
  this->has_automatic_name_ = false;
  return this;
}

Assistant:

CLI11_INLINE App *App::name(std::string app_name) {

    if(parent_ != nullptr) {
        std::string oname = name_;
        name_ = app_name;
        const auto &res = _compare_subcommand_names(*this, *_get_fallthrough_parent());
        if(!res.empty()) {
            name_ = oname;
            throw(OptionAlreadyAdded(app_name + " conflicts with existing subcommand names"));
        }
    } else {
        name_ = app_name;
    }
    has_automatic_name_ = false;
    return this;
}